

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time-test.cc
# Opt level: O0

void __thiscall TimeTest_GrowBuffer_Test::TestBody(TimeTest_GrowBuffer_Test *this)

{
  time_t t;
  int i;
  string s;
  string local_68 [32];
  time_t local_48;
  int iVar1;
  undefined4 in_stack_ffffffffffffffc4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"{:",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  for (iVar1 = 0; iVar1 < 0x1e; iVar1 = iVar1 + 1) {
    std::__cxx11::string::operator+=(local_28,"%c");
  }
  std::__cxx11::string::operator+=(local_28,"}\n");
  local_48 = time((time_t *)0x0);
  localtime(&local_48);
  fmt::v5::format<std::__cxx11::string,tm>
            (in_stack_ffffffffffffffc8,(tm *)CONCAT44(in_stack_ffffffffffffffc4,iVar1));
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

TEST(TimeTest, GrowBuffer) {
  std::string s = "{:";
  for (int i = 0; i < 30; ++i)
    s += "%c";
  s += "}\n";
  std::time_t t = std::time(FMT_NULL);
  fmt::format(s, *std::localtime(&t));
}